

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal)

{
  Fts5Config *pFVar1;
  bool bVar2;
  sqlite3_value **ppsVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  Fts5Config *pFVar8;
  sqlite3_stmt *psVar9;
  long lVar10;
  sqlite3_stmt *pDel;
  sqlite3_stmt *pSeek;
  sqlite3_stmt *local_70;
  Fts5Config *local_68;
  sqlite3_stmt *local_60;
  Fts5Storage *local_58;
  undefined4 local_50;
  int local_4c;
  sqlite3_stmt *local_48;
  sqlite3_value **local_40;
  i64 local_38;
  
  pFVar8 = p->pConfig;
  local_70 = (sqlite3_stmt *)0x0;
  iVar4 = fts5StorageLoadTotals(p,1);
  if (iVar4 != 0) {
    return iVar4;
  }
  pFVar1 = p->pConfig;
  local_60 = (sqlite3_stmt *)0x0;
  if (apVal == (sqlite3_value **)0x0) {
    iVar4 = fts5StorageGetStmt(p,2,&local_60,(char **)0x0);
    psVar9 = local_60;
    if (iVar4 != 0) {
      return iVar4;
    }
    sqlite3_bind_int64(local_60,1,iDel);
    iVar4 = sqlite3_step(psVar9);
    if (iVar4 != 100) {
      iVar4 = sqlite3_reset(psVar9);
      goto LAB_001d17db;
    }
  }
  else {
    psVar9 = (sqlite3_stmt *)0x0;
  }
  local_50 = 0xffffffff;
  local_68 = pFVar8;
  local_58 = p;
  local_38 = iDel;
  iVar5 = sqlite3Fts5IndexBeginWrite(p->pIndex,1,iDel);
  if (iVar5 == 0) {
    lVar10 = 1;
    local_48 = psVar9;
    local_40 = apVal;
    do {
      ppsVar3 = local_40;
      bVar2 = pFVar1->nCol < lVar10;
      if (pFVar1->nCol < lVar10) {
        iVar5 = 0;
        break;
      }
      iVar5 = 0;
      if (pFVar1->abUnindexed[lVar10 + -1] == '\0') {
        if (psVar9 == (sqlite3_stmt *)0x0) {
          puVar6 = (uchar *)sqlite3ValueText(local_40[lVar10 + -1],'\x01');
          psVar9 = local_48;
          iVar4 = sqlite3ValueBytes(ppsVar3[lVar10 + -1],'\x01');
        }
        else {
          puVar6 = sqlite3_column_text(psVar9,(int)lVar10);
          iVar4 = sqlite3_column_bytes(psVar9,(int)lVar10);
        }
        local_4c = 0;
        if (puVar6 == (uchar *)0x0) {
          lVar7 = 0;
          iVar5 = 0;
        }
        else {
          iVar5 = (*pFVar1->pTokApi->xTokenize)
                            (pFVar1->pTok,&local_58,4,(char *)puVar6,iVar4,fts5StorageInsertCallback
                            );
          lVar7 = (long)local_4c;
        }
        p->aTotalSize[lVar10 + -1] = p->aTotalSize[lVar10 + -1] - lVar7;
      }
      lVar10 = lVar10 + 1;
    } while (iVar5 == 0);
  }
  else {
    bVar2 = false;
  }
  p->nTotalRow = p->nTotalRow + -1;
  iVar4 = sqlite3_reset(psVar9);
  pFVar8 = local_68;
  iDel = local_38;
  if (!bVar2) {
    iVar4 = iVar5;
  }
LAB_001d17db:
  if (iVar4 != 0) {
    return iVar4;
  }
  if (pFVar8->bColumnsize == 0) {
    if (pFVar8->eContent != 0) {
      return 0;
    }
  }
  else {
    iVar4 = fts5StorageGetStmt(p,7,&local_70,(char **)0x0);
    psVar9 = local_70;
    if (iVar4 != 0) {
      return iVar4;
    }
    sqlite3_bind_int64(local_70,1,iDel);
    sqlite3_step(psVar9);
    iVar4 = sqlite3_reset(psVar9);
    if (pFVar8->eContent != 0 || iVar4 != 0) {
      return iVar4;
    }
  }
  iVar4 = fts5StorageGetStmt(p,5,&local_70,(char **)0x0);
  psVar9 = local_70;
  if (iVar4 == 0) {
    sqlite3_bind_int64(local_70,1,iDel);
    sqlite3_step(psVar9);
    iVar4 = sqlite3_reset(psVar9);
  }
  return iVar4;
}

Assistant:

static int sqlite3Fts5StorageDelete(Fts5Storage *p, i64 iDel, sqlite3_value **apVal){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = fts5StorageDeleteFromIndex(p, iDel, apVal);
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}